

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O1

sx_job_t sx_job_dispatch(sx_job_context *ctx,int count,sx_job_cb *callback,void *user,
                        sx_job_priority priority,uint tags)

{
  sx_lock_t sVar1;
  sx_pool *psVar2;
  sx__job_pending *psVar3;
  code *pcVar4;
  int iVar5;
  int range_end;
  sx_job_t puVar6;
  long *plVar7;
  sx__pool_page *psVar8;
  sx__pool_page *psVar9;
  sx__job *psVar10;
  undefined4 *puVar11;
  uint32_t uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  sx__pool_page *psVar16;
  long lVar17;
  sx_job_priority *psVar18;
  uint32_t count_00;
  ulong uVar19;
  int iVar20;
  uint32_t uVar21;
  int range_start;
  int i;
  
  if (count < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x11f,"count > 0");
    pcVar4 = (code *)swi(3);
    puVar6 = (sx_job_t)(*pcVar4)();
    return puVar6;
  }
  plVar7 = (long *)sx_tls_get(ctx->thread_tls);
  uVar13 = ctx->num_threads;
  if (tags == 0) {
    uVar12 = uVar13 + 1;
  }
  else if ((int)uVar13 < 0) {
    uVar12 = 0;
  }
  else {
    lVar17 = 0;
    uVar12 = 0;
    do {
      uVar12 = (uVar12 + 1) - (uint)((ctx->tags[lVar17] & tags) == 0);
      lVar17 = lVar17 + 1;
    } while ((ulong)uVar13 + 1 != lVar17);
  }
  iVar5 = count / (int)uVar12;
  uVar21 = (uint32_t)((long)count % (long)(int)uVar12);
  uVar19 = (long)count % (long)(int)uVar12 & 0xffffffff;
  count_00 = 0;
  if (0 < (int)uVar21) {
    count_00 = uVar21;
  }
  if (0 < iVar5) {
    count_00 = uVar12;
  }
  if ((int)count_00 < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x132,"num_jobs > 0");
    pcVar4 = (code *)swi(3);
    puVar6 = (sx_job_t)(*pcVar4)();
    return puVar6;
  }
  if (ctx->job_pool->capacity < (int)count_00) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x134,"this amount of jobs at a time cannot be done. increase max_jobs");
    pcVar4 = (code *)swi(3);
    puVar6 = (sx_job_t)(*pcVar4)();
    return puVar6;
  }
  while( true ) {
    LOCK();
    sVar1 = ctx->counter_lk;
    ctx->counter_lk = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (ctx->counter_lk != 0);
  }
  psVar2 = ctx->counter_pool;
  for (psVar8 = psVar2->pages; (psVar8 != (sx__pool_page *)0x0 && (psVar8->iter < 1));
      psVar8 = psVar8->next) {
  }
  if (psVar8 == (sx__pool_page *)0x0) {
    uVar13 = psVar2->capacity;
    uVar14 = (ulong)uVar13;
    iVar20 = psVar2->item_sz;
    psVar8 = (sx__pool_page *)
             (*ctx->alloc->alloc_cb)
                       ((void *)0x0,((long)iVar20 + 8) * (long)(int)uVar13 + 0x20,0x10,
                        "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                        "sx_job_t sx_job_dispatch(sx_job_context *, int, sx_job_cb *, void *, sx_job_priority, unsigned int)"
                        ,0x139,ctx->alloc->user_data);
    if (psVar8 == (sx__pool_page *)0x0) {
      sx__mem_run_fail_callback
                ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h",
                 0x3e);
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0x3e,"Out of memory");
      pcVar4 = (code *)swi(3);
      puVar6 = (sx_job_t)(*pcVar4)();
      return puVar6;
    }
    psVar8->iter = uVar13;
    psVar8->ptrs = &psVar8[1].ptrs;
    psVar8->buff = (uint8_t *)(&psVar8[1].ptrs + (int)uVar13);
    psVar8->next = (sx__pool_page *)0x0;
    if (0 < (int)uVar13) {
      lVar17 = 0;
      do {
        psVar8->ptrs[uVar14 - 1] = psVar8->buff + lVar17;
        lVar17 = lVar17 + iVar20;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    memset(psVar8->buff,0,(long)(int)(iVar20 * uVar13));
    if (psVar8 != (sx__pool_page *)0x0) {
      psVar16 = psVar2->pages;
      do {
        psVar9 = psVar16;
        psVar16 = psVar9->next;
      } while (psVar16 != (sx__pool_page *)0x0);
      psVar9->next = psVar8;
    }
  }
  psVar8 = ctx->counter_pool->pages;
  do {
    psVar16 = psVar8;
    iVar20 = psVar16->iter;
    if (iVar20 != 0) break;
    psVar8 = psVar16->next;
  } while (psVar16->next != (sx__pool_page *)0x0);
  if (iVar20 < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0x8f,"capacity is full");
    pcVar4 = (code *)swi(3);
    puVar6 = (sx_job_t)(*pcVar4)();
    return puVar6;
  }
  psVar16->iter = iVar20 - 1U;
  puVar6 = (sx_job_t)psVar16->ptrs[iVar20 - 1U];
  ctx->counter_lk = 0;
  if (puVar6 == (sx_job_t)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x13d,"Maximum job instances exceeded");
    pcVar4 = (code *)swi(3);
    puVar6 = (sx_job_t)(*pcVar4)();
    return puVar6;
  }
  *puVar6 = count_00;
  if (plVar7 == (long *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x142,"Dispatch must be called within main thread or job threads");
    pcVar4 = (code *)swi(3);
    puVar6 = (sx_job_t)(*pcVar4)();
    return puVar6;
  }
  if (*plVar7 != 0) {
    *(sx_job_t *)(*plVar7 + 0x38) = puVar6;
  }
  while( true ) {
    LOCK();
    sVar1 = ctx->job_lk;
    ctx->job_lk = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (ctx->job_lk != 0);
  }
  for (psVar8 = ctx->job_pool->pages;
      (psVar8 != (sx__pool_page *)0x0 && (psVar8->iter < (int)count_00)); psVar8 = psVar8->next) {
  }
  if (psVar8 != (sx__pool_page *)0x0) {
    if (0 < (int)count_00) {
      uVar12 = 0;
      iVar20 = (uint)(0 < (int)uVar21) + iVar5;
      range_start = 0;
      do {
        range_end = iVar20;
        psVar10 = sx__new_job(ctx,uVar12,callback,user,range_start,range_end,puVar6,tags,priority);
        if (ctx->waiting_list_last[priority] != (sx__job *)0x0) {
          ctx->waiting_list_last[priority]->next = psVar10;
          psVar10->prev = ctx->waiting_list_last[priority];
        }
        ctx->waiting_list_last[priority] = psVar10;
        if (ctx->waiting_list[priority] == (sx__job *)0x0) {
          ctx->waiting_list[priority] = psVar10;
        }
        iVar20 = (int)uVar19;
        uVar12 = uVar12 + 1;
        uVar21 = iVar20 - 1;
        uVar19 = (ulong)uVar21;
        iVar20 = (uint)(1 < iVar20) + iVar5 + range_end;
        range_start = range_end;
      } while (count_00 != uVar12);
    }
    if (1 < (int)uVar21) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                        0x158,"range_reminder <= 0");
      pcVar4 = (code *)swi(3);
      puVar6 = (sx_job_t)(*pcVar4)();
      return puVar6;
    }
    sx_semaphore_post(&ctx->sem,count_00);
  }
  else {
    psVar3 = ctx->pending;
    if ((psVar3 == (sx__job_pending *)0x0) ||
       ((int)psVar3[-1].priority <= (int)(psVar3[-1].tags + 1))) {
      if (psVar3 == (sx__job_pending *)0x0) {
        uVar13 = 0;
      }
      else {
        uVar13 = psVar3[-1].priority * 2;
      }
      if (psVar3 == (sx__job_pending *)0x0) {
        uVar15 = 1;
      }
      else {
        uVar15 = psVar3[-1].tags + 1;
      }
      if ((int)uVar15 < (int)uVar13) {
        uVar15 = uVar13;
      }
      uVar19 = 8;
      if (8 < (int)uVar15) {
        uVar19 = (ulong)uVar15;
      }
      psVar18 = &psVar3[-1].priority;
      if (psVar3 == (sx__job_pending *)0x0) {
        psVar18 = (sx_job_priority *)0x0;
      }
      puVar11 = (undefined4 *)
                (*ctx->alloc->alloc_cb)
                          (psVar18,uVar19 * 0x28 + 8,0,
                           "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                           ,"sx_job_dispatch",0x166,ctx->alloc->user_data);
      if (puVar11 == (undefined4 *)0x0) {
        sx__mem_run_fail_callback
                  ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/array.h"
                   ,0x6d);
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/array.h"
                          ,0x6d,"Out of memory");
        pcVar4 = (code *)swi(3);
        puVar6 = (sx_job_t)(*pcVar4)();
        return puVar6;
      }
      *puVar11 = (int)uVar19;
      if (psVar3 == (sx__job_pending *)0x0) {
        puVar11[1] = 0;
      }
      ctx->pending = (sx__job_pending *)(puVar11 + 2);
    }
    psVar3 = ctx->pending;
    uVar12 = psVar3[-1].tags;
    psVar3[-1].tags = uVar12 + 1;
    psVar3[(int)uVar12].counter = puVar6;
    psVar3[(int)uVar12].range_size = iVar5;
    psVar3[(int)uVar12].range_reminder = uVar21;
    psVar3[(int)uVar12].callback = callback;
    psVar3[(int)uVar12].user = user;
    psVar3[(int)uVar12].priority = priority;
    psVar3[(int)uVar12].tags = tags;
  }
  ctx->job_lk = 0;
  return puVar6;
}

Assistant:

sx_job_t sx_job_dispatch(sx_job_context* ctx, int count, sx_job_cb* callback, void* user,
                         sx_job_priority priority, unsigned int tags)
{
    sx_assert(count > 0);

    sx__job_thread_data* tdata = (sx__job_thread_data*)sx_tls_get(ctx->thread_tls);

    // Divide job count into ranges
    // check which threads are eligible to execute this task (based on tags)
    int num_workers = 0;
    if (tags != 0) {
        for (int i = 0, ic = ctx->num_threads + 1; i < ic; i++) {
            if (ctx->tags[i] & tags)
                num_workers++;
        }
    } else {
        num_workers = ctx->num_threads + 1;
    }

    int range_size = count / num_workers;
    int range_reminder = count % num_workers;
    int num_jobs = range_size > 0 ? num_workers : (range_reminder > 0 ? range_reminder : 0);
    sx_assert(num_jobs > 0);
    sx_assertf(num_jobs <= ctx->job_pool->capacity,
              "this amount of jobs at a time cannot be done. increase max_jobs");

    // Create a counter (job handle)
    sx_job_t counter;
    sx_lock(ctx->counter_lk) {
        counter = (sx_job_t)sx_pool_new_and_grow(ctx->counter_pool, ctx->alloc);
    }

    if (!counter) {
        sx_assertf(0, "Maximum job instances exceeded");
        return NULL;
    }

    sx_atomic_store32_explicit(counter, (uint32_t)num_jobs, SX_ATOMIC_MEMORYORDER_RELEASE);
    sx_assertf(tdata, "Dispatch must be called within main thread or job threads");

    // Another job is running on this thread. So depend the current running job to the new
    // dispatches
    if (tdata->cur_job)
        tdata->cur_job->wait_counter = counter;

    // Push jobs to the end of the list, so they can be collected by threads
    sx_lock(ctx->job_lk) {
        if (!sx_pool_fulln(ctx->job_pool, num_jobs)) {
            int range_start = 0;
            int range_end = range_size + (range_reminder > 0 ? 1 : 0);
            --range_reminder;

            for (int i = 0; i < num_jobs; i++) {
                sx__job_add_list(&ctx->waiting_list[priority], &ctx->waiting_list_last[priority],
                                 sx__new_job(ctx, i, callback, user, range_start, range_end, counter,
                                             tags, priority));
                range_start = range_end;
                range_end += (range_size + (range_reminder > 0 ? 1 : 0));
                --range_reminder;
            }
            sx_assert(range_reminder <= 0);

            // Post to semaphore to worker threads start cur_job
            sx_semaphore_post(&ctx->sem, num_jobs);
        } else {
            SX_PRAGMA_DIAGNOSTIC_PUSH()
            SX_PRAGMA_DIAGNOSTIC_IGNORED_MSVC(4204)     // nonstandard extension used: non-constant aggregate initializer
            sx__job_pending pending = { .counter = counter,
                                        .range_size = range_size,
                                        .range_reminder = range_reminder,
                                        .callback = callback,
                                        .user = user,
                                        .priority = priority,
                                        .tags = tags };
            sx_array_push(ctx->alloc, ctx->pending, pending);
            SX_PRAGMA_DIAGNOSTIC_POP()   
        }
    }   // lock

    return counter;
}